

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_rar.c
# Opt level: O1

int execute_filter(archive_read *a,rar_filter *filter,rar_virtual_machine *vm,size_t pos)

{
  uint8_t uVar1;
  uint uVar2;
  uint32_t uVar3;
  uint64_t uVar4;
  int iVar5;
  uint uVar6;
  uint8_t *puVar7;
  ulong uVar8;
  uint uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  uint8_t *puVar13;
  uint8_t uVar14;
  int iVar15;
  ulong uVar16;
  short sVar17;
  uint uVar18;
  int iVar19;
  byte bVar20;
  uint uVar21;
  uint uVar22;
  int iVar23;
  ulong uVar24;
  byte *pbVar25;
  char local_98 [14];
  char cStack_8a;
  int local_88 [12];
  byte local_58;
  undefined3 uStack_57;
  rar_filter *local_48;
  uint local_3c;
  uint8_t *local_38;
  
  uVar4 = filter->prog->fingerprint;
  if ((long)uVar4 < 0x393cd7e57e) {
    if (uVar4 == 0x1d0e06077d) {
      uVar2 = filter->initialregisters[4];
      if ((ulong)uVar2 < 0x1e001) {
        uVar3 = filter->initialregisters[0];
        if (uVar3 != 0) {
          puVar7 = vm->memory;
          uVar21 = 0;
          do {
            if (uVar21 < uVar2) {
              uVar14 = '\0';
              uVar18 = uVar21;
              do {
                uVar1 = *puVar7;
                puVar7 = puVar7 + 1;
                uVar14 = uVar14 - uVar1;
                vm->memory[(ulong)uVar18 + (ulong)uVar2] = uVar14;
                uVar18 = uVar18 + uVar3;
              } while (uVar18 < uVar2);
            }
            uVar21 = uVar21 + 1;
          } while (uVar21 != uVar3);
        }
        filter->filteredblockaddress = uVar2;
        filter->filteredblocklength = uVar2;
        return 1;
      }
      return 0;
    }
    if (uVar4 != 0x35ad576887) {
LAB_0015418d:
      archive_set_error(&a->archive,0x54,"No support for RAR VM program filter");
      return 0;
    }
    iVar19 = 0;
  }
  else {
    if (uVar4 != 0x393cd7e57e) {
      if (uVar4 == 0x951c2c5dc8) {
        uVar2 = filter->initialregisters[4];
        if (uVar2 < filter->initialregisters[0] || 0x1e000 < uVar2) {
          return 0;
        }
        uVar21 = filter->initialregisters[1];
        uVar16 = (ulong)uVar2;
        puVar7 = vm->memory;
        puVar13 = vm->memory + uVar16;
        lVar12 = uVar16 - filter->initialregisters[0];
        uVar8 = 0;
        do {
          if (uVar8 < uVar16) {
            bVar20 = 0;
            uVar24 = uVar8;
            do {
              pbVar25 = (byte *)((long)vm + uVar24 + lVar12 + 0x20);
              if (puVar13 <= pbVar25) {
                uVar9 = (uint)*(byte *)((long)vm + uVar24 + lVar12 + 0x20);
                uVar6 = *(byte *)((long)vm + uVar24 + lVar12 + 0x23) - uVar9;
                uVar18 = -uVar6;
                if (0 < (int)uVar6) {
                  uVar18 = uVar6;
                }
                uVar9 = bVar20 - uVar9;
                uVar22 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar22 = uVar9;
                }
                uVar9 = uVar9 + uVar6;
                uVar6 = -uVar9;
                if (0 < (int)uVar9) {
                  uVar6 = uVar9;
                }
                if (((uVar22 & 0xff) < (uVar18 & 0xff)) || (uVar6 < (uVar18 & 0xff))) {
                  if ((uVar22 & 0xff) <= uVar6) {
                    pbVar25 = (byte *)((long)vm + uVar24 + lVar12 + 0x23);
                  }
                  bVar20 = *pbVar25;
                }
              }
              bVar20 = bVar20 - *puVar7;
              puVar7 = puVar7 + 1;
              vm->memory[uVar24 + uVar16] = bVar20;
              uVar24 = uVar24 + 3;
            } while (uVar24 < uVar16);
          }
          uVar8 = uVar8 + 1;
        } while (uVar8 != 3);
        for (; uVar21 < uVar2 - 2; uVar21 = uVar21 + 3) {
          puVar13[uVar21] = puVar13[uVar21] + puVar13[uVar21 + 1];
          puVar13[uVar21 + 2] = puVar13[uVar21 + 2] + puVar13[uVar21 + 1];
        }
        filter->filteredblockaddress = uVar2;
        filter->filteredblocklength = uVar2;
      }
      else {
        if (uVar4 != 0xd8bc85e701) goto LAB_0015418d;
        uVar2 = filter->initialregisters[4];
        if (0x1e000 < (ulong)uVar2) {
          return 0;
        }
        local_48 = filter;
        uVar3 = filter->initialregisters[0];
        if (uVar3 != 0) {
          local_38 = vm->memory + uVar2;
          puVar7 = vm->memory;
          local_3c = 0;
          do {
            local_88[8] = 0;
            local_88[9] = 0;
            local_88[10] = 0;
            local_88[0xb] = 0;
            local_88[4] = 0;
            local_88[5] = 0;
            local_88[6] = 0;
            local_88[7] = 0;
            local_88[0] = 0;
            local_88[1] = 0;
            local_88[2] = 0;
            local_88[3] = 0;
            if (local_3c < uVar2) {
              local_98[0] = '\0';
              local_98[1] = '\0';
              uVar18 = 0;
              cStack_8a = '\0';
              local_58 = 0;
              local_98[2] = '\0';
              uVar21 = local_3c;
              iVar19 = 0;
              do {
                iVar15 = (int)(char)*puVar7;
                sVar17 = (short)uVar18;
                iVar23 = (int)cStack_8a;
                uVar6 = uVar18 & 0xffff;
                uVar18 = iVar23 - iVar19;
                bVar20 = (char)((int)local_98[2] * uVar6 + (uint)local_58 * 8 +
                                (int)local_98[1] * uVar18 + local_98[0] * iVar23 >> 3) - *puVar7;
                iVar19 = iVar15 * 8;
                iVar11 = iVar15 * -8;
                if (iVar15 * -8 < 0) {
                  iVar11 = iVar19;
                }
                iVar10 = iVar19 - iVar23;
                iVar5 = -iVar10;
                if (0 < iVar10) {
                  iVar5 = iVar10;
                }
                local_88[1] = local_88[1] + iVar5;
                local_88[0] = local_88[0] + iVar11;
                iVar11 = iVar23 + iVar15 * 8;
                iVar5 = -iVar11;
                if (0 < iVar11) {
                  iVar5 = iVar11;
                }
                iVar10 = iVar19 - (short)uVar18;
                iVar11 = -iVar10;
                if (0 < iVar10) {
                  iVar11 = iVar10;
                }
                local_88[3] = local_88[3] + iVar11;
                local_88[2] = local_88[2] + iVar5;
                iVar11 = (int)(short)uVar18 + iVar15 * 8;
                iVar5 = -iVar11;
                if (0 < iVar11) {
                  iVar5 = iVar11;
                }
                iVar19 = iVar19 - sVar17;
                iVar11 = -iVar19;
                if (0 < iVar19) {
                  iVar11 = iVar19;
                }
                local_88[5] = local_88[5] + iVar11;
                local_88[4] = local_88[4] + iVar5;
                iVar19 = (int)sVar17 + iVar15 * 8;
                iVar11 = -iVar19;
                if (0 < iVar19) {
                  iVar11 = iVar19;
                }
                local_88[6] = local_88[6] + iVar11;
                cStack_8a = bVar20 - local_58;
                local_58 = bVar20;
                uStack_57 = 0;
                (vm->memory + uVar2)[uVar21] = bVar20;
                uVar6 = local_88[0xb] & 0x1f;
                local_88[0xb] = local_88[0xb] + 1;
                if (uVar6 == 0) {
                  lVar12 = 5;
                  uVar8 = 0;
                  do {
                    if (*(int *)(local_98 + lVar12 * 4) < local_88[uVar8]) {
                      uVar8 = (ulong)((int)lVar12 - 4U & 0xff);
                    }
                    lVar12 = lVar12 + 1;
                  } while (lVar12 != 0xb);
                  local_88[8] = 0;
                  local_88[9] = 0;
                  local_88[10] = 0;
                  local_88[4] = 0;
                  local_88[5] = 0;
                  local_88[6] = 0;
                  local_88[7] = 0;
                  local_88[0] = 0;
                  local_88[1] = 0;
                  local_88[2] = 0;
                  local_88[3] = 0;
                  switch((int)uVar8) {
                  case 1:
                    if (-0x11 < local_98[0]) {
                      local_98[0] = local_98[0] + -1;
                    }
                    break;
                  case 2:
                    if (local_98[0] < '\x10') {
                      local_98[0] = local_98[0] + '\x01';
                    }
                    break;
                  case 3:
                    if (-0x11 < local_98[1]) {
                      local_98[1] = local_98[1] + -1;
                    }
                    break;
                  case 4:
                    if (local_98[1] < '\x10') {
                      local_98[1] = local_98[1] + '\x01';
                    }
                    break;
                  case 5:
                    if (-0x11 < local_98[2]) {
                      local_98[2] = local_98[2] + -1;
                    }
                    break;
                  case 6:
                    if (local_98[2] < '\x10') {
                      local_98[2] = local_98[2] + '\x01';
                    }
                  }
                }
                puVar7 = puVar7 + 1;
                uVar21 = uVar21 + uVar3;
                iVar19 = iVar23;
              } while (uVar21 < uVar2);
            }
            local_3c = local_3c + 1;
          } while (local_3c != uVar3);
        }
        filter->filteredblockaddress = uVar2;
        filter->filteredblocklength = uVar2;
      }
      return 1;
    }
    iVar19 = 1;
  }
  iVar19 = execute_filter_e8(filter,vm,pos,iVar19);
  return iVar19;
}

Assistant:

static int
execute_filter(struct archive_read *a, struct rar_filter *filter, struct rar_virtual_machine *vm, size_t pos)
{
  if (filter->prog->fingerprint == 0x1D0E06077D)
    return execute_filter_delta(filter, vm);
  if (filter->prog->fingerprint == 0x35AD576887)
    return execute_filter_e8(filter, vm, pos, 0);
  if (filter->prog->fingerprint == 0x393CD7E57E)
    return execute_filter_e8(filter, vm, pos, 1);
  if (filter->prog->fingerprint == 0x951C2C5DC8)
    return execute_filter_rgb(filter, vm);
  if (filter->prog->fingerprint == 0xD8BC85E701)
    return execute_filter_audio(filter, vm);

  archive_set_error(&a->archive, ARCHIVE_ERRNO_FILE_FORMAT, "No support for RAR VM program filter");
  return 0;
}